

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall ghc::filesystem::path::root_path(path *this)

{
  undefined8 in_RSI;
  path *in_RDI;
  format fmt;
  string_type *source;
  path *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  string local_a0 [8];
  path *in_stack_ffffffffffffff68;
  string_type local_70;
  string local_50 [32];
  string local_30 [48];
  
  fmt = (format)((ulong)in_RSI >> 0x20);
  source = &local_70;
  root_name(in_stack_ffffffffffffff68);
  string_abi_cxx11_(in_RDI);
  root_directory(in_stack_ffffffffffffff68);
  string_abi_cxx11_(in_RDI);
  std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  path(in_stack_ffffffffffffff40,source,fmt);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_a0);
  ~path((path *)0x1d32dc);
  std::__cxx11::string::~string(local_50);
  ~path((path *)0x1d32f3);
  return in_RDI;
}

Assistant:

GHC_INLINE path path::root_path() const
{
    return path(root_name().string() + root_directory().string(), native_format);
}